

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

void __thiscall QString::resize(QString *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  long alloc;
  
  alloc = 0;
  if (0 < size) {
    alloc = size;
  }
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (pDVar1 == (Data *)0x0) {
      lVar2 = 0;
      lVar3 = 0;
    }
    else {
      lVar2 = (pDVar1->super_QArrayData).alloc;
      lVar3 = (long)((long)(this->d).ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
              1;
    }
    if (alloc <= lVar2 - lVar3) goto LAB_0011f646;
  }
  reallocData(this,alloc,Grow);
LAB_0011f646:
  (this->d).size = alloc;
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) && ((pDVar1->super_QArrayData).alloc != 0)) {
    (this->d).ptr[alloc] = L'\0';
  }
  return;
}

Assistant:

void QString::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    if (d->needsDetach() || needsReallocate(*this, size))
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = u'\0';
}